

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall
FIX::Session::generateResendRequest(Session *this,BeginString *beginString,MsgSeqNum *msgSeqNum)

{
  _func_int **pp_Var1;
  int iVar2;
  SEQNUM SVar3;
  uint64_t uVar4;
  IntTConvertor<unsigned_long> *pIVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint64_t uVar8;
  long *plVar9;
  ulong *puVar10;
  unsigned_long value;
  unsigned_long value_00;
  ulong uVar11;
  undefined8 uVar12;
  string *psVar13;
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  Message resendRequest;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  long lStack_2f0;
  string local_2e8;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  undefined1 local_2a8 [16];
  _Alloc_hider local_298 [4];
  _Alloc_hider local_278;
  size_type local_270;
  field_metrics local_258;
  undefined1 local_250 [80];
  field_metrics local_200;
  string local_1f8;
  undefined1 local_1d8 [16];
  _Alloc_hider local_1c8;
  char local_1b8 [16];
  _Alloc_hider local_1a8;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  field_metrics local_188;
  Message local_180;
  
  local_2a8._0_8_ = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a8,&MsgType_ResendRequest,0x1cd8a3);
  local_1d8._0_8_ = &PTR__FieldBase_001f55c8;
  local_1d8._8_4_ = 0x23;
  local_1c8._M_p = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,local_2a8._0_8_,
             (long)(pointer *)local_2a8._0_8_ + CONCAT44(local_2a8._12_4_,local_2a8._8_4_));
  local_1a8._M_p = (pointer)&local_198;
  local_1a0 = 0;
  local_198._M_local_buf[0] = '\0';
  local_188.m_length = 0;
  local_188.m_checksum = 0;
  local_1d8._0_8_ = &PTR__FieldBase_001f6658;
  newMessage(&local_180,this,(MsgType *)local_1d8);
  FieldBase::~FieldBase((FieldBase *)local_1d8);
  if ((_Alloc_hider *)local_2a8._0_8_ != local_298) {
    operator_delete((void *)local_2a8._0_8_,(ulong)(local_298[0]._M_p + 1));
  }
  SVar3 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
  UInt64Field::UInt64Field((UInt64Field *)local_1d8,7,(long)(int)SVar3);
  local_1d8._0_8_ = &PTR__FieldBase_001f7020;
  uVar4 = UInt64Field::getValue(&msgSeqNum->super_SeqNumField);
  UInt64Field::UInt64Field((UInt64Field *)local_2a8,0x10,uVar4 - 1);
  local_2a8._0_8_ = &PTR__FieldBase_001f6f78;
  psVar13 = &(beginString->super_StringField).super_FieldBase.m_string;
  iVar2 = std::__cxx11::string::compare((char *)psVar13);
  if (iVar2 < 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar13);
    if (iVar2 < 1) {
      UInt64Field::UInt64Field((UInt64Field *)local_250,0x10,999999);
      local_250._0_8_ = &PTR__FieldBase_001f6f78;
      local_2a8._8_4_ = local_250._8_4_;
      std::__cxx11::string::_M_assign((string *)local_298);
      goto LAB_001a9a0f;
    }
  }
  else {
    UInt64Field::UInt64Field((UInt64Field *)local_250,0x10,0);
    local_250._0_8_ = &PTR__FieldBase_001f6f78;
    local_2a8._8_4_ = local_250._8_4_;
    std::__cxx11::string::_M_assign((string *)local_298);
LAB_001a9a0f:
    local_258 = local_200;
    local_270 = 0;
    *local_278._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)local_250);
  }
  FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)local_1d8,true);
  FieldMap::setField(&local_180.super_FieldMap,(FieldBase *)local_2a8,true);
  fill(this,&local_180.m_header);
  sendRaw(this,&local_180,0);
  pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_1d8);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_1f8,pIVar5,value);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x1cdeab);
  plVar9 = plVar6 + 2;
  if ((long *)*plVar6 == plVar9) {
    local_2b8 = *plVar9;
    lStack_2b0 = plVar6[3];
    local_2c8 = &local_2b8;
  }
  else {
    local_2b8 = *plVar9;
    local_2c8 = (long *)*plVar6;
  }
  local_2c0 = plVar6[1];
  *plVar6 = (long)plVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_2c8);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_2f8 = *puVar10;
    lStack_2f0 = plVar6[3];
    local_308 = &local_2f8;
  }
  else {
    local_2f8 = *puVar10;
    local_308 = (ulong *)*plVar6;
  }
  local_300 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pIVar5 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_2a8);
  IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_2e8,pIVar5,value_00);
  uVar11 = 0xf;
  if (local_308 != &local_2f8) {
    uVar11 = local_2f8;
  }
  if (uVar11 < local_2e8._M_string_length + local_300) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      uVar12 = local_2e8.field_2._M_allocated_capacity;
    }
    if (local_2e8._M_string_length + local_300 <= (ulong)uVar12) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,(ulong)local_308);
      goto LAB_001a9bf7;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_2e8._M_dataplus._M_p);
LAB_001a9bf7:
  local_250._0_8_ = local_250 + 0x10;
  pp_Var1 = (_func_int **)(puVar7 + 2);
  if ((_func_int **)*puVar7 == pp_Var1) {
    local_250._16_8_ = *pp_Var1;
    local_250._24_8_ = puVar7[3];
  }
  else {
    local_250._16_8_ = *pp_Var1;
    local_250._0_8_ = (_func_int **)*puVar7;
  }
  local_250._8_8_ = puVar7[1];
  *puVar7 = pp_Var1;
  puVar7[1] = 0;
  *(undefined1 *)pp_Var1 = 0;
  SessionState::onEvent(&this->m_state,(string *)local_250);
  if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
    operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  uVar4 = UInt64Field::getValue((UInt64Field *)local_1d8);
  uVar8 = UInt64Field::getValue(&msgSeqNum->super_SeqNumField);
  (this->m_state).m_resendRange.first = uVar4;
  (this->m_state).m_resendRange.second = uVar8 - 1;
  FieldBase::~FieldBase((FieldBase *)local_2a8);
  FieldBase::~FieldBase((FieldBase *)local_1d8);
  Message::~Message(&local_180);
  return;
}

Assistant:

void Session::generateResendRequest(const BeginString &beginString, const MsgSeqNum &msgSeqNum) {
  Message resendRequest = newMessage(MsgType(MsgType_ResendRequest));

  BeginSeqNo beginSeqNo((int)getExpectedTargetNum());
  EndSeqNo endSeqNo(msgSeqNum - 1);
  if (beginString >= FIX::BeginString_FIX42) {
    endSeqNo = 0;
  } else if (beginString <= FIX::BeginString_FIX41) {
    endSeqNo = 999999;
  }
  resendRequest.setField(beginSeqNo);
  resendRequest.setField(endSeqNo);
  fill(resendRequest.getHeader());
  sendRaw(resendRequest);

  m_state.onEvent(
      "Sent ResendRequest FROM: " + SEQNUM_CONVERTOR::convert(beginSeqNo)
      + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

  m_state.resendRange(beginSeqNo, msgSeqNum - 1);
}